

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeSetName(xmlNodePtr cur,xmlChar *name)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *local_30;
  xmlChar *freeme;
  xmlDictPtr dict;
  xmlDocPtr doc;
  xmlChar *name_local;
  xmlNodePtr cur_local;
  
  local_30 = (xmlChar *)0x0;
  if (((cur != (xmlNodePtr)0x0) && (name != (xmlChar *)0x0)) &&
     ((xVar1 = cur->type, xVar1 - XML_ELEMENT_NODE < 2 ||
      ((1 < xVar1 - XML_TEXT_NODE &&
       ((xVar1 - XML_ENTITY_REF_NODE < 3 ||
        ((xVar1 != XML_COMMENT_NODE &&
         ((xVar1 == XML_DOCUMENT_NODE ||
          ((3 < xVar1 - XML_DOCUMENT_TYPE_NODE &&
           ((xVar1 - XML_DTD_NODE < 4 || (2 < xVar1 - XML_NAMESPACE_DECL)))))))))))))))) {
    if (cur->doc == (_xmlDoc *)0x0) {
      freeme = (xmlChar *)0x0;
    }
    else {
      freeme = (xmlChar *)cur->doc->dict;
    }
    if (freeme == (xmlChar *)0x0) {
      if (cur->name != (xmlChar *)0x0) {
        local_30 = cur->name;
      }
      pxVar3 = xmlStrdup(name);
      cur->name = pxVar3;
    }
    else {
      if ((cur->name != (xmlChar *)0x0) &&
         (iVar2 = xmlDictOwns((xmlDictPtr)freeme,cur->name), iVar2 == 0)) {
        local_30 = cur->name;
      }
      pxVar3 = xmlDictLookup((xmlDictPtr)freeme,name,-1);
      cur->name = pxVar3;
    }
    if (local_30 != (xmlChar *)0x0) {
      (*xmlFree)(local_30);
    }
  }
  return;
}

Assistant:

void
xmlNodeSetName(xmlNodePtr cur, const xmlChar *name) {
    xmlDocPtr doc;
    xmlDictPtr dict;
    const xmlChar *freeme = NULL;

    if (cur == NULL) return;
    if (name == NULL) return;
    switch(cur->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_HTML_DOCUMENT_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    return;
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
        case XML_PI_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_DTD_NODE:
        case XML_DOCUMENT_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	    break;
    }
    doc = cur->doc;
    if (doc != NULL)
	dict = doc->dict;
    else
        dict = NULL;
    if (dict != NULL) {
        if ((cur->name != NULL) && (!xmlDictOwns(dict, cur->name)))
	    freeme = cur->name;
	cur->name = xmlDictLookup(dict, name, -1);
    } else {
	if (cur->name != NULL)
	    freeme = cur->name;
	cur->name = xmlStrdup(name);
    }

    if (freeme)
        xmlFree((xmlChar *) freeme);
}